

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

BasicBlock * __thiscall IR::IRBuilder::newBasicBlock(IRBuilder *this)

{
  std::forward_list<IR::BasicBlock,std::allocator<IR::BasicBlock>>::emplace_front<IR::Function*&>
            ((forward_list<IR::BasicBlock,std::allocator<IR::BasicBlock>> *)
             &this->function_->blocks_,&this->function_);
  return (BasicBlock *)
         ((this->function_->blocks_).
          super__Fwd_list_base<IR::BasicBlock,_std::allocator<IR::BasicBlock>_>._M_impl._M_head.
          _M_next + 1);
}

Assistant:

BasicBlock* IRBuilder::newBasicBlock() {
  function_->blocks_.emplace_front(function_);
  return &function_->blocks_.front();
}